

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O2

int parsedate(char *date,time_t *output)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  int *piVar7;
  int i;
  int iVar8;
  char **what;
  char **ppcVar9;
  long lVar10;
  uint uVar11;
  byte *pbVar12;
  byte *pbVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  int local_90;
  int local_8c;
  int local_88;
  uint local_84;
  int local_80;
  int len;
  int minnum;
  int hournum;
  int local_70;
  uint local_6c;
  char buf [32];
  
  hournum = -1;
  minnum = -1;
  local_88 = -1;
  local_90 = -1;
  local_84 = 0;
  local_6c = 0;
  iVar8 = -1;
  lVar15 = 0xffffffff;
  pbVar12 = (byte *)date;
  local_8c = local_90;
  local_80 = local_90;
  do {
    bVar3 = *pbVar12;
    if ((bVar3 == 0) || (5 < local_6c)) {
      if (local_88 == -1) {
        hournum = 0;
        minnum = 0;
        local_88 = 0;
      }
      iVar4 = -1;
      if ((((local_80 != -1) && (iVar8 != -1)) && (0x62e < local_8c)) &&
         ((local_88 < 0x3d && minnum < 0x3c) && (hournum < 0x18 && (iVar8 < 0xc && local_80 < 0x20))
         )) {
        uVar11 = local_8c - (uint)(iVar8 < 2);
        iVar4 = 0;
        if (local_90 == -1) {
          local_90 = iVar4;
        }
        *output = ((((long)local_80 + (long)(local_8c + -0x7b2) * 0x16d +
                     (long)*(int *)(time2epoch_month_days_cumulative + (long)iVar8 * 4) +
                    (long)(int)(uVar11 / 400 + ((uVar11 >> 2) - uVar11 / 100) + -0x1dd)) * 0x18 +
                   (long)hournum) * 0x3c + (long)minnum) * 0x3c + (long)local_90 + (long)local_88 +
                  -0x15180;
      }
      return iVar4;
    }
    lVar14 = 0;
    while (bVar3 != 0) {
      iVar4 = Curl_isalnum((uint)bVar3);
      if (iVar4 != 0) {
        uVar11 = (uint)pbVar12[lVar14];
        goto LAB_00132229;
      }
      lVar10 = lVar14 + 1;
      lVar14 = lVar14 + 1;
      bVar3 = pbVar12[lVar10];
    }
    uVar11 = 0;
LAB_00132229:
    iVar4 = Curl_isalpha(uVar11);
    pbVar13 = pbVar12 + lVar14;
    if (iVar4 == 0) {
      iVar4 = Curl_isdigit((uint)*pbVar13);
      if (iVar4 != 0) {
        len = 0;
        if (local_88 == -1) {
          iVar4 = __isoc99_sscanf(pbVar13,"%02d:%02d:%02d%n",&hournum,&minnum,&local_88,&len);
          if (iVar4 == 3) {
            pbVar13 = pbVar12 + len + lVar14;
          }
          else {
            if ((local_88 != -1) ||
               (iVar4 = __isoc99_sscanf(pbVar13,"%02d:%02d%n",&hournum,&minnum,&len), iVar4 != 2))
            goto LAB_00132290;
            pbVar13 = pbVar12 + len + lVar14;
            local_88 = 0;
          }
        }
        else {
LAB_00132290:
          piVar7 = __errno_location();
          local_70 = *piVar7;
          *piVar7 = 0;
          lVar10 = strtol((char *)pbVar13,(char **)buf,10);
          iVar4 = *piVar7;
          if (iVar4 != local_70) {
            *piVar7 = local_70;
          }
          if (iVar4 != 0) {
            return -1;
          }
          if (lVar10 - 0x80000000U < 0xffffffff00000000) {
            return -1;
          }
          iVar4 = curlx_sltosi(lVar10);
          lVar10 = (buf._0_8_ - (long)pbVar12) - lVar14;
          if (local_90 == -1) {
            bVar1 = false;
            if ((date < pbVar13) && ((buf._0_8_ - (long)pbVar12) + -4 == lVar14)) {
              local_90 = -1;
              if (iVar4 < 0x579) {
                bVar3 = pbVar12[lVar14 + -1];
                if ((bVar3 != 0x2d) && (bVar3 != 0x2b)) {
                  lVar10 = 4;
                  goto LAB_001324df;
                }
                iVar5 = (iVar4 / 100) * 0x3c + iVar4 % 100;
                local_90 = iVar5 * -0x3c;
                if (bVar3 != 0x2b) {
                  local_90 = iVar5 * 0x3c;
                }
                bVar1 = true;
                lVar10 = 4;
              }
            }
            else {
LAB_001324df:
              bVar1 = false;
              local_90 = -1;
            }
          }
          else {
            bVar1 = false;
          }
          if ((((lVar10 == 8) && (local_8c == -1)) && (iVar8 == -1)) && (local_80 == -1)) {
            local_8c = iVar4 / 10000;
            iVar8 = (int)(short)((short)((long)iVar4 % 10000) / 100 + -1);
            local_80 = iVar4 % 100;
            bVar1 = true;
          }
          bVar2 = (bool)(local_80 == -1 & local_84 == 0 & ~bVar1);
          bVar16 = iVar4 - 1U < 0x1f;
          iVar5 = -1;
          if (bVar16) {
            iVar5 = iVar4;
          }
          if (bVar2) {
            local_84 = 1;
            local_80 = iVar5;
          }
          bVar16 = (bool)(bVar16 & bVar2);
          pbVar13 = (byte *)buf._0_8_;
          if (((bVar16 || bVar1) || (local_84 != 1)) || (local_8c != -1)) {
            if (!bVar16 && !bVar1) {
              return -1;
            }
          }
          else {
            if (iVar4 < 100) {
              if (iVar4 < 0x47) {
                iVar4 = iVar4 + 2000;
              }
              else {
                iVar4 = iVar4 + 0x76c;
              }
            }
            local_84 = (uint)(local_80 != -1);
            local_8c = iVar4;
          }
        }
      }
    }
    else {
      buf[0x10] = '\0';
      buf[0x11] = '\0';
      buf[0x12] = '\0';
      buf[0x13] = '\0';
      buf[0x14] = '\0';
      buf[0x15] = '\0';
      buf[0x16] = '\0';
      buf[0x17] = '\0';
      buf[0x18] = '\0';
      buf[0x19] = '\0';
      buf[0x1a] = '\0';
      buf[0x1b] = '\0';
      buf[0x1c] = '\0';
      buf[0x1d] = '\0';
      buf[0x1e] = '\0';
      buf[0x1f] = '\0';
      buf[0] = '\0';
      buf[1] = '\0';
      buf[2] = '\0';
      buf[3] = '\0';
      buf[4] = '\0';
      buf[5] = '\0';
      buf[6] = '\0';
      buf[7] = '\0';
      buf[8] = '\0';
      buf[9] = '\0';
      buf[10] = '\0';
      buf[0xb] = '\0';
      buf[0xc] = '\0';
      buf[0xd] = '\0';
      buf[0xe] = '\0';
      buf[0xf] = '\0';
      iVar4 = __isoc99_sscanf(pbVar13,"%31[ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz]",
                              buf);
      if (iVar4 == 0) {
        sVar6 = 0;
      }
      else {
        sVar6 = strlen(buf);
      }
      if ((int)lVar15 == -1) {
        ppcVar9 = Curl_wkday;
        if (3 < sVar6) {
          ppcVar9 = weekday;
        }
        for (lVar15 = 0; (int)lVar15 != 7; lVar15 = lVar15 + 1) {
          iVar4 = Curl_strcasecompare(buf,ppcVar9[lVar15]);
          if (iVar4 != 0) goto LAB_00132419;
        }
        lVar15 = 0xffffffff;
      }
      if (iVar8 == -1) {
        ppcVar9 = Curl_month;
        for (iVar8 = 0; iVar8 != 0xc; iVar8 = iVar8 + 1) {
          iVar4 = Curl_strcasecompare(buf,*ppcVar9);
          if (iVar4 != 0) goto LAB_00132419;
          ppcVar9 = ppcVar9 + 1;
        }
        iVar8 = -1;
      }
      if (local_90 != -1) {
        return -1;
      }
      lVar10 = 0;
      while( true ) {
        if ((int)lVar10 == 0x33c) {
          return -1;
        }
        iVar4 = Curl_strcasecompare(buf,tz[0].name + lVar10);
        if (iVar4 != 0) break;
        lVar10 = lVar10 + 0xc;
      }
      local_90 = *(int *)(tz[0].name + lVar10 + 8) * 0x3c;
LAB_00132419:
      pbVar13 = pbVar12 + lVar14 + sVar6;
    }
    local_6c = local_6c + 1;
    pbVar12 = pbVar13;
  } while( true );
}

Assistant:

static int parsedate(const char *date, time_t *output)
{
  time_t t = 0;
  int wdaynum = -1;  /* day of the week number, 0-6 (mon-sun) */
  int monnum = -1;   /* month of the year number, 0-11 */
  int mdaynum = -1; /* day of month, 1 - 31 */
  int hournum = -1;
  int minnum = -1;
  int secnum = -1;
  int yearnum = -1;
  int tzoff = -1;
  enum assume dignext = DATE_MDAY;
  const char *indate = date; /* save the original pointer */
  int part = 0; /* max 6 parts */

  while(*date && (part < 6)) {
    bool found = FALSE;

    skip(&date);

    if(ISALPHA(*date)) {
      /* a name coming up */
      char buf[32]="";
      size_t len;
      if(sscanf(date, "%31[ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                          "abcdefghijklmnopqrstuvwxyz]", buf))
        len = strlen(buf);
      else
        len = 0;

      if(wdaynum == -1) {
        wdaynum = checkday(buf, len);
        if(wdaynum != -1)
          found = TRUE;
      }
      if(!found && (monnum == -1)) {
        monnum = checkmonth(buf);
        if(monnum != -1)
          found = TRUE;
      }

      if(!found && (tzoff == -1)) {
        /* this just must be a time zone string */
        tzoff = checktz(buf);
        if(tzoff != -1)
          found = TRUE;
      }

      if(!found)
        return PARSEDATE_FAIL; /* bad string */

      date += len;
    }
    else if(ISDIGIT(*date)) {
      /* a digit */
      int val;
      char *end;
      int len = 0;
      if((secnum == -1) &&
         (3 == sscanf(date, "%02d:%02d:%02d%n",
                      &hournum, &minnum, &secnum, &len))) {
        /* time stamp! */
        date += len;
      }
      else if((secnum == -1) &&
              (2 == sscanf(date, "%02d:%02d%n", &hournum, &minnum, &len))) {
        /* time stamp without seconds */
        date += len;
        secnum = 0;
      }
      else {
        long lval;
        int error;
        int old_errno;

        old_errno = errno;
        errno = 0;
        lval = strtol(date, &end, 10);
        error = errno;
        if(errno != old_errno)
          errno = old_errno;

        if(error)
          return PARSEDATE_FAIL;

#if LONG_MAX != INT_MAX
        if((lval > (long)INT_MAX) || (lval < (long)INT_MIN))
          return PARSEDATE_FAIL;
#endif

        val = curlx_sltosi(lval);

        if((tzoff == -1) &&
           ((end - date) == 4) &&
           (val <= 1400) &&
           (indate< date) &&
           ((date[-1] == '+' || date[-1] == '-'))) {
          /* four digits and a value less than or equal to 1400 (to take into
             account all sorts of funny time zone diffs) and it is preceded
             with a plus or minus. This is a time zone indication.  1400 is
             picked since +1300 is frequently used and +1400 is mentioned as
             an edge number in the document "ISO C 200X Proposal: Timezone
             Functions" at http://david.tribble.com/text/c0xtimezone.html If
             anyone has a more authoritative source for the exact maximum time
             zone offsets, please speak up! */
          found = TRUE;
          tzoff = (val/100 * 60 + val%100)*60;

          /* the + and - prefix indicates the local time compared to GMT,
             this we need their reversed math to get what we want */
          tzoff = date[-1]=='+'?-tzoff:tzoff;
        }

        if(((end - date) == 8) &&
           (yearnum == -1) &&
           (monnum == -1) &&
           (mdaynum == -1)) {
          /* 8 digits, no year, month or day yet. This is YYYYMMDD */
          found = TRUE;
          yearnum = val/10000;
          monnum = (val%10000)/100-1; /* month is 0 - 11 */
          mdaynum = val%100;
        }

        if(!found && (dignext == DATE_MDAY) && (mdaynum == -1)) {
          if((val > 0) && (val<32)) {
            mdaynum = val;
            found = TRUE;
          }
          dignext = DATE_YEAR;
        }

        if(!found && (dignext == DATE_YEAR) && (yearnum == -1)) {
          yearnum = val;
          found = TRUE;
          if(yearnum < 100) {
            if(yearnum > 70)
              yearnum += 1900;
            else
              yearnum += 2000;
          }
          if(mdaynum == -1)
            dignext = DATE_MDAY;
        }

        if(!found)
          return PARSEDATE_FAIL;

        date = end;
      }
    }

    part++;
  }

  if(-1 == secnum)
    secnum = minnum = hournum = 0; /* no time, make it zero */

  if((-1 == mdaynum) ||
     (-1 == monnum) ||
     (-1 == yearnum))
    /* lacks vital info, fail */
    return PARSEDATE_FAIL;

#ifdef HAVE_TIME_T_UNSIGNED
  if(yearnum < 1970) {
    /* only positive numbers cannot return earlier */
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#if (SIZEOF_TIME_T < 5)

#ifdef HAVE_TIME_T_UNSIGNED
  /* an unsigned 32 bit time_t can only hold dates to 2106 */
  if(yearnum > 2105) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
#else
  /* a signed 32 bit time_t can only hold dates to the beginning of 2038 */
  if(yearnum > 2037) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
  if(yearnum < 1903) {
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#else
  /* The Gregorian calendar was introduced 1582 */
  if(yearnum < 1583)
    return PARSEDATE_FAIL;
#endif

  if((mdaynum > 31) || (monnum > 11) ||
     (hournum > 23) || (minnum > 59) || (secnum > 60))
    return PARSEDATE_FAIL; /* clearly an illegal date */

  /* time2epoch() returns a time_t. time_t is often 32 bits, sometimes even on
     architectures that feature 64 bit 'long' but ultimately time_t is the
     correct data type to use.
  */
  t = time2epoch(secnum, minnum, hournum, mdaynum, monnum, yearnum);

  /* Add the time zone diff between local time zone and GMT. */
  if(tzoff == -1)
    tzoff = 0;

  if((tzoff > 0) && (t > TIME_T_MAX - tzoff)) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER; /* time_t overflow */
  }

  t += tzoff;

  *output = t;

  return PARSEDATE_OK;
}